

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChVector<double>::operator=
          (ChVector<double> *this,
          MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *vec)

{
  CoeffReturnType pdVar1;
  
  pdVar1 = Eigen::
           DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>,_0>::
           operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>
                       *)vec,0);
  this->m_data[0] = *pdVar1;
  pdVar1 = Eigen::
           DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>,_0>::
           operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>
                       *)vec,1);
  this->m_data[1] = *pdVar1;
  pdVar1 = Eigen::
           DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>,_0>::
           operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>
                       *)vec,2);
  this->m_data[2] = *pdVar1;
  return this;
}

Assistant:

ChVector& operator=(const Eigen::MatrixBase<Derived>& vec) {
        m_data[0] = vec(0);
        m_data[1] = vec(1);
        m_data[2] = vec(2);
        return *this;
    }